

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall Buffer::Buffer(Buffer *this,string *path,EndianessMode _endianess)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  ExceptionFreeserf *pEVar4;
  size_t sVar5;
  void *pvVar6;
  allocator<char> local_2b1;
  string local_2b0;
  fpos local_290 [23];
  undefined1 local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  char local_228 [8];
  ifstream file;
  EndianessMode _endianess_local;
  string *path_local;
  Buffer *this_local;
  
  std::enable_shared_from_this<Buffer>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Buffer>);
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_001a5b78;
  this->owned = true;
  std::shared_ptr<Buffer>::shared_ptr(&this->parent);
  this->endianess = _endianess;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(local_228,pcVar3,_Var2);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_279 = 1;
    pEVar4 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::operator+(&local_278,"Failed to open file \'",path);
    std::operator+(&local_258,&local_278,"\'");
    ExceptionFreeserf::ExceptionFreeserf(pEVar4,&local_258);
    local_279 = 0;
    __cxa_throw(pEVar4,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  local_290._0_16_ = std::istream::tellg();
  sVar5 = std::fpos::operator_cast_to_long(local_290);
  this->size = sVar5;
  std::istream::seekg((long)local_228,_S_beg);
  pvVar6 = malloc(this->size);
  this->data = pvVar6;
  if (this->data == (void *)0x0) {
    pEVar4 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Failed to allocate memory",&local_2b1);
    ExceptionFreeserf::ExceptionFreeserf(pEVar4,&local_2b0);
    __cxa_throw(pEVar4,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  std::istream::read(local_228,(long)this->data);
  std::ifstream::close();
  this->read = (uint8_t *)this->data;
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

Buffer::Buffer(const std::string &path, EndianessMode _endianess)
  : owned(true)
  , endianess(_endianess) {
  std::ifstream file(path.c_str(), std::ios::binary | std::ios::ate);
  if (!file.good()) {
    throw ExceptionFreeserf("Failed to open file '" + path + "'");
  }

  size = size_t(file.tellg());

  file.seekg(0, file.beg);

  data = ::malloc(size);
  if (data == nullptr) {
    throw ExceptionFreeserf("Failed to allocate memory");
  }

  file.read(reinterpret_cast<char*>(data), size);
  file.close();

  read = reinterpret_cast<uint8_t*>(data);
}